

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

SampledSpectrum
pbrt::detail::
Dispatch<pbrt::Camera::We(pbrt::Ray_const&,pbrt::SampledWavelengths&,pbrt::Point2<float>*)const::__0&,pbrt::SampledSpectrum,pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
          (anon_class_24_3_5805e4d1 *func,void *ptr,int index)

{
  array<float,_4> aVar1;
  int in_EDX;
  anon_class_24_3_5805e4d1 *in_RSI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  SampledSpectrum SVar12;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar6 [56];
  undefined1 auVar11 [56];
  
  auVar11 = in_ZMM1._8_56_;
  auVar6 = in_ZMM0._8_56_;
  if (in_EDX == 0) {
    SVar12 = const::$_0::operator()(in_RSI,(PerspectiveCamera *)0x0);
    auVar7._0_8_ = SVar12.values.values._8_8_;
    auVar7._8_56_ = auVar11;
    auVar2._0_8_ = SVar12.values.values._0_8_;
    auVar2._8_56_ = auVar6;
    local_10 = vmovlpd_avx(auVar2._0_16_);
    local_8 = vmovlpd_avx(auVar7._0_16_);
  }
  else if (in_EDX == 1) {
    SVar12 = const::$_0::operator()(in_RSI,(OrthographicCamera *)0x100000001);
    auVar8._0_8_ = SVar12.values.values._8_8_;
    auVar8._8_56_ = auVar11;
    auVar3._0_8_ = SVar12.values.values._0_8_;
    auVar3._8_56_ = auVar6;
    local_10 = vmovlpd_avx(auVar3._0_16_);
    local_8 = vmovlpd_avx(auVar8._0_16_);
  }
  else if (in_EDX == 2) {
    SVar12 = const::$_0::operator()(in_RSI,(SphericalCamera *)0x200000002);
    auVar9._0_8_ = SVar12.values.values._8_8_;
    auVar9._8_56_ = auVar11;
    auVar4._0_8_ = SVar12.values.values._0_8_;
    auVar4._8_56_ = auVar6;
    local_10 = vmovlpd_avx(auVar4._0_16_);
    local_8 = vmovlpd_avx(auVar9._0_16_);
  }
  else {
    SVar12 = const::$_0::operator()(in_RSI,(RealisticCamera *)CONCAT44(in_EDX,in_EDX));
    auVar10._0_8_ = SVar12.values.values._8_8_;
    auVar10._8_56_ = auVar11;
    auVar5._0_8_ = SVar12.values.values._0_8_;
    auVar5._8_56_ = auVar6;
    local_10 = vmovlpd_avx(auVar5._0_16_);
    local_8 = vmovlpd_avx(auVar10._0_16_);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 4);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    default:
        return func((const T3 *)ptr);
    }
}